

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCore.c
# Opt level: O1

void Cec_ManFraSetDefaultParams(Cec_ParFra_t *p)

{
  p->nWords = 0;
  p->nRounds = 0;
  p->nItersMax = 0;
  p->nBTLimit = 0;
  p->TimeLimit = 0;
  p->nLevelMax = 0;
  p->nDepthMax = 0;
  p->fRewriting = 0;
  p->fRunCSat = 0;
  p->fVeryVerbose = 0;
  p->fVerbose = 0;
  p->iOutFail = 0;
  p->fCheckMiter = 0;
  p->fDualOut = 0;
  p->fColorDiff = 0;
  p->fSatSweeping = 0;
  p->nWords = 0xf;
  p->nRounds = 0xf;
  p->TimeLimit = 0;
  p->nItersMax = 10;
  p->nBTLimit = 100;
  p->nLevelMax = 0;
  p->nDepthMax = 1;
  p->fVeryVerbose = 0;
  p->fVerbose = 0;
  p->fRewriting = 0;
  p->fCheckMiter = 0;
  p->fDualOut = 0;
  p->fColorDiff = 0;
  p->fSatSweeping = 0;
  p->iOutFail = -1;
  return;
}

Assistant:

void Cec_ManFraSetDefaultParams( Cec_ParFra_t * p )
{
    memset( p, 0, sizeof(Cec_ParFra_t) );
    p->nWords         =      15;  // the number of simulation words
    p->nRounds        =      15;  // the number of simulation rounds
    p->TimeLimit      =       0;  // the runtime limit in seconds
    p->nItersMax      =      10;  // the maximum number of iterations of SAT sweeping
    p->nBTLimit       =     100;  // conflict limit at a node
    p->nLevelMax      =       0;  // restriction on the level of nodes to be swept
    p->nDepthMax      =       1;  // the depth in terms of steps of speculative reduction
    p->fRewriting     =       0;  // enables AIG rewriting
    p->fCheckMiter    =       0;  // the circuit is the miter
//    p->fFirstStop     =       0;  // stop on the first sat output
    p->fDualOut       =       0;  // miter with separate outputs
    p->fColorDiff     =       0;  // miter with separate outputs
    p->fSatSweeping   =       0;  // enable SAT sweeping
    p->fVeryVerbose   =       0;  // verbose stats
    p->fVerbose       =       0;  // verbose stats
    p->iOutFail       =      -1;  // the failed output
}